

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

int __thiscall QToolBarAreaLayout::remove(QToolBarAreaLayout *this,char *__filename)

{
  long *plVar1;
  int extraout_EAX;
  pointer pQVar2;
  pointer pQVar3;
  long lVar4;
  long extraout_RAX;
  ulong i;
  ulong i_00;
  long lVar5;
  QToolBarAreaLayoutInfo *this_00;
  
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
LAB_00470302:
      return (int)lVar4;
    }
    this_00 = this->docks + lVar4;
    for (i_00 = 0; i = 0xffffffffffffffff, i_00 < (ulong)(this_00->lines).d.size; i_00 = i_00 + 1) {
      pQVar2 = QList<QToolBarAreaLayoutLine>::data(&this_00->lines);
      lVar5 = 0;
      while (i = i + 1, i < (ulong)pQVar2[i_00].toolBarItems.d.size) {
        pQVar3 = QList<QToolBarAreaLayoutItem>::data(&pQVar2[i_00].toolBarItems);
        plVar1 = (long *)((long)&pQVar3->widgetItem + lVar5);
        lVar5 = lVar5 + 0x18;
        if ((char *)*plVar1 == __filename) {
          QList<QToolBarAreaLayoutItem>::removeAt(&pQVar2[i_00].toolBarItems,i);
          lVar4 = extraout_RAX;
          if (pQVar2[i_00].toolBarItems.d.size == 0) {
            QList<QToolBarAreaLayoutLine>::removeAt(&this_00->lines,i_00);
            return extraout_EAX;
          }
          goto LAB_00470302;
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void QToolBarAreaLayout::remove(QLayoutItem *item)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); k++) {
                if (line.toolBarItems[k].widgetItem == item) {
                    line.toolBarItems.removeAt(k);
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return;
                }
            }
        }
    }
}